

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O1

void __thiscall
helics::FederateState::logMessage
          (FederateState *this,int level,string_view logMessageSource,string_view message,
          bool fromRemote)

{
  ulong uVar1;
  string *psVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__s;
  size_type __len2;
  string_view header_00;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  string timeString;
  string header;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88;
  string local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  size_type sStack_40;
  
  args_01.field_1 =
       (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)message._M_str;
  __s = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)logMessageSource._M_str;
  __len2 = logMessageSource._M_len;
  if (this->maxLogLevel < level && !fromRemote) {
    return;
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  local_a8._M_string_length = 0;
  local_a8.field_2._M_local_buf[0] = '\0';
  uVar1 = (this->time_granted).internalTimeCode;
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_local_buf[0] = '\0';
  if ((long)uVar1 < 0) {
    psVar2 = fedStateString_abi_cxx11_((this->state)._M_i);
    local_88._M_dataplus._M_p = (psVar2->_M_dataplus)._M_p;
    local_88._M_string_length = psVar2->_M_string_length;
    fmt.size_ = 0xd;
    fmt.data_ = (char *)0x4;
    args.field_1.values_ = args_01.field_1.values_;
    args.desc_ = (unsigned_long_long)&local_88;
    ::fmt::v11::vformat_abi_cxx11_(&local_68,(v11 *)"[{}]",fmt,args);
LAB_00311f3b:
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_c8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,(ulong)(local_68.field_2._M_allocated_capacity + 1))
      ;
    }
  }
  else {
    if (uVar1 != 0x7fffffffffffffff) {
      local_88._M_dataplus._M_p =
           (pointer)((double)((int)uVar1 + (int)(uVar1 / 1000000000) * -1000000000) * 1e-09 +
                    (double)(uVar1 / 1000000000));
      fmt_01.size_ = 10;
      fmt_01.data_ = (char *)0x4;
      args_01.desc_ = (unsigned_long_long)&local_88;
      ::fmt::v11::vformat_abi_cxx11_(&local_68,(v11 *)"[{}]",fmt_01,args_01);
      goto LAB_00311f3b;
    }
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&local_c8,0,0,"[MAXTIME]",9);
  }
  if (__len2 == 0) {
    local_68._M_dataplus._M_p = (this->name)._M_dataplus._M_p;
    local_68._M_string_length = (this->name)._M_string_length;
    local_68.field_2._M_allocated_capacity._0_4_ = (this->global_id)._M_i.gid;
    local_48 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_c8._M_dataplus._M_p;
    sStack_40 = local_c8._M_string_length;
    fmt_00.size_ = 0xd1d;
    fmt_00.data_ = (char *)0x9;
    args_00.field_1.values_ = args_01.field_1.values_;
    args_00.desc_ = (unsigned_long_long)&local_68;
    ::fmt::v11::vformat_abi_cxx11_(&local_88,(v11 *)"{} ({}){}",fmt_00,args_00);
  }
  else {
    if (__s->_M_local_buf[__len2 - 1] == ']') {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_replace(&local_a8,0,local_a8._M_string_length,__s->_M_local_buf,__len2);
      goto LAB_00311df3;
    }
    local_68.field_2._M_allocated_capacity = (size_type)local_c8._M_dataplus._M_p;
    local_68.field_2._8_8_ = local_c8._M_string_length;
    fmt_02.size_ = 0xdd;
    fmt_02.data_ = (char *)0x4;
    args_02.field_1.values_ = args_01.field_1.values_;
    args_02.desc_ = (unsigned_long_long)&local_68;
    local_68._M_dataplus._M_p = (pointer)__s;
    local_68._M_string_length = __len2;
    ::fmt::v11::vformat_abi_cxx11_(&local_88,(v11 *)0x45b718,fmt_02,args_02);
  }
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_a8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
LAB_00311df3:
  header_00._M_str = local_a8._M_dataplus._M_p;
  header_00._M_len = local_a8._M_string_length;
  LogManager::sendToLogger
            ((this->mLogManager)._M_t.
             super___uniq_ptr_impl<helics::LogManager,_std::default_delete<helics::LogManager>_>.
             _M_t.
             super__Tuple_impl<0UL,_helics::LogManager_*,_std::default_delete<helics::LogManager>_>.
             super__Head_base<0UL,_helics::LogManager_*,_false>._M_head_impl,level,header_00,
             (string_view)message,fromRemote);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,
                    CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                             local_c8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,
                    CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                             local_a8.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void FederateState::logMessage(int level,
                               std::string_view logMessageSource,
                               std::string_view message,
                               bool fromRemote) const
{
    if (level > maxLogLevel && !fromRemote) {
        return;
    }
    std::string header;
    auto currentTime = grantedTime();
    std::string timeString;
    if (currentTime < timeZero) {
        timeString = fmt::format("[{}]", fedStateString(getState()));
    } else if (currentTime == Time::maxVal()) {
        timeString = "[MAXTIME]";
    } else {
        timeString = fmt::format("[{}]", static_cast<double>(grantedTime()));
    }
    if (logMessageSource.empty()) {
        header = fmt::format("{} ({}){}", name, global_id.load().baseValue(), timeString);
    } else if (logMessageSource.back() == ']') {
        header = logMessageSource;
    } else {
        header = fmt::format("{}{}", logMessageSource, timeString);
    }

    mLogManager->sendToLogger(level, header, message, fromRemote);
}